

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_string_set(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  operand local_94;
  operand local_90 [3];
  operand local_84;
  string in_bounds;
  operand local_5c;
  string not_in_bounds;
  string error;
  
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&in_bounds,psVar1,in_RDX);
    std::__cxx11::string::operator=((string *)&error,(string *)&in_bounds);
    std::__cxx11::string::~string((string *)&in_bounds);
    in_bounds._M_dataplus._M_p._0_4_ = 5;
    not_in_bounds._M_dataplus._M_p._0_4_ = 0x14;
    local_90[0] = 0x39;
    local_94 = BL;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90,(int *)&local_94);
    in_bounds._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&in_bounds,&error);
    jump_if_arg_is_not_block(code,RCX,R11,&error);
  }
  not_in_bounds._M_dataplus._M_p._0_4_ = 2;
  local_90[0] = RCX;
  local_94 = NUMBER;
  in_bounds._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&not_in_bounds,local_90,&local_94,(unsigned_long *)&in_bounds);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_does_not_point_to_string(code,RCX,R11,&error);
    in_bounds._M_dataplus._M_p._0_4_ = 0x5a;
    not_in_bounds._M_dataplus._M_p._0_4_ = 0xc;
    local_90[0] = NUMBER;
    local_94 = AL;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90,(int *)&local_94);
    in_bounds._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&in_bounds,&error);
    in_bounds._M_dataplus._M_p._0_4_ = 0x40;
    not_in_bounds._M_dataplus._M_p._0_4_ = 0x14;
    local_90[0] = RSI;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90);
    in_bounds._M_dataplus._M_p._0_4_ = 2;
    not_in_bounds._M_dataplus._M_p._0_4_ = 0x14;
    local_90[0] = NUMBER;
    local_94 = 0xff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90,(int *)&local_94);
    in_bounds._M_dataplus._M_p._0_4_ = 5;
    not_in_bounds._M_dataplus._M_p._0_4_ = 0x14;
    local_90[0] = NUMBER;
    local_94 = R14;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90,(int *)&local_94);
    in_bounds._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&in_bounds,&error);
  }
  in_bounds._M_dataplus._M_p._0_4_ = 0x4e;
  not_in_bounds._M_dataplus._M_p._0_4_ = 0xc;
  local_90[0] = NUMBER;
  local_94 = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90,(int *)&local_94);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&in_bounds,psVar1,lab);
    psVar1 = label;
    label = label + 1;
    label_to_string_abi_cxx11_(&not_in_bounds,psVar1,lab_00);
    local_90[0] = 0x40;
    local_94 = RAX;
    local_84 = MEM_RCX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_90,&local_94,&local_84);
    local_94 = ST6;
    local_84 = R15;
    local_5c = NUMBER;
    local_90[0] = ~EMPTY;
    local_90[1] = 0xffffff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
              (code,&local_94,&local_84,&local_5c,(long *)local_90);
    local_90[0] = AH;
    local_94 = RAX;
    local_84 = R15;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_90,&local_94,&local_84);
    local_90[0] = XMM13|CL;
    local_94 = RAX;
    local_84 = NUMBER;
    local_5c = BL;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_90,&local_94,&local_84,(int *)&local_5c);
    local_90[0] = CL;
    local_94 = RDX;
    local_84 = RAX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_90,&local_94,&local_84);
    local_90[0] = ST2;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_90,&not_in_bounds);
    local_90[0] = CL;
    local_94 = RDX;
    local_84 = NUMBER;
    local_5c = EMPTY;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_90,&local_94,&local_84,(int *)&local_5c);
    local_90[0] = ST2;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_90,&in_bounds);
    error_label(code,&not_in_bounds,re_string_set_out_of_bounds);
    local_90[0] = ST4;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_90,&in_bounds);
    std::__cxx11::string::~string((string *)&not_in_bounds);
    std::__cxx11::string::~string((string *)&in_bounds);
  }
  in_bounds._M_dataplus._M_p = in_bounds._M_dataplus._M_p & 0xffffffff00000000;
  not_in_bounds._M_dataplus._M_p._0_4_ = 0xc;
  local_90[0] = NUMBER;
  local_94 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90,(int *)&local_94);
  in_bounds._M_dataplus._M_p = in_bounds._M_dataplus._M_p & 0xffffffff00000000;
  not_in_bounds._M_dataplus._M_p._0_4_ = 0xb;
  local_90[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90);
  in_bounds._M_dataplus._M_p._0_4_ = 0x40;
  not_in_bounds._M_dataplus._M_p._0_4_ = 9;
  local_90[0] = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90);
  in_bounds._M_dataplus._M_p._0_4_ = 0x56;
  not_in_bounds._M_dataplus._M_p._0_4_ = 9;
  local_90[0] = NUMBER;
  local_94 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90,(int *)&local_94);
  in_bounds._M_dataplus._M_p._0_4_ = 0x40;
  not_in_bounds._M_dataplus._M_p._0_4_ = 0x2b;
  local_90[0] = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90);
  in_bounds._M_dataplus._M_p._0_4_ = 0x40;
  not_in_bounds._M_dataplus._M_p._0_4_ = 9;
  local_90[0] = 0xd;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&in_bounds,(operand *)&not_in_bounds,local_90);
  in_bounds._M_dataplus._M_p._0_4_ = 0x2c;
  not_in_bounds._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&in_bounds,(operand *)&not_in_bounds);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_string_set_contract_violation);
  }
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void compile_string_set(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
    code.add(asmcode::JNE, error);
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error); // assembly can jump short, but vm cannot
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  // here check whether it is a string and a char
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_string(code, asmcode::RCX, asmcode::R11, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    code.add(asmcode::MOV, asmcode::R11, asmcode::RSI);
    code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, char_mask);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, char_tag);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::SAR, asmcode::RDX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    {
    // optionally, check whether rdx is in bounds.
    std::string in_bounds = label_to_string(label++);
    std::string not_in_bounds = label_to_string(label++);
    code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
    code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, block_size_mask);
    code.add(asmcode::AND, asmcode::RAX, asmcode::R15);
    code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 3);
    code.add(asmcode::CMP, asmcode::RDX, asmcode::RAX);
    code.add(asmcode::JGES, not_in_bounds);
    code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, 0);
    code.add(asmcode::JGES, in_bounds);
    error_label(code, not_in_bounds, re_string_set_out_of_bounds);
    code.add(asmcode::LABEL, in_bounds);
    }

  code.add(asmcode::ADD, asmcode::RDX, asmcode::NUMBER, 8); // increase 8 for header
  code.add(asmcode::ADD, asmcode::RCX, asmcode::RDX);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RSI);
  code.add(asmcode::SHR, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::MOV, asmcode::BYTE_MEM_RCX, asmcode::AL);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RSI);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_string_set_contract_violation);
    }
  }